

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayGenerateMipMapFilterable::initTest
          (TextureCubeMapArrayGenerateMipMapFilterable *this)

{
  vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_> *this_00;
  pointer pSVar1;
  pointer pSVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  long lVar6;
  char *msg;
  uint uVar7;
  ulong uVar8;
  StorageConfig storage_config_2;
  StorageConfig storage_config_1;
  StorageConfig storage_config_4;
  StorageConfig storage_config_3;
  long lVar5;
  
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  this_00 = &this->m_storage_configs;
  pSVar2 = (this->m_storage_configs).
           super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_storage_configs).
      super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar2) {
    (this->m_storage_configs).
    super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar2;
  }
  (**(code **)(lVar5 + 0xff0))(0xd05,1);
  (**(code **)(lVar5 + 0xff0))(0xcf5,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glPixelStorei() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                  ,0xcf);
  storage_config_1.m_depth = 0x12;
  storage_config_1.m_height = 0x40;
  storage_config_1.m_to_id = 0;
  storage_config_1.m_width = 0x40;
  storage_config_1.m_levels = getAmountOfLevelsForTexture(0x40,0x40);
  storage_config_2.m_depth = 6;
  storage_config_2.m_height = 0x75;
  storage_config_2.m_to_id = 0;
  storage_config_2.m_width = 0x75;
  storage_config_2.m_levels = getAmountOfLevelsForTexture(0x75,0x75);
  storage_config_3.m_depth = 6;
  storage_config_3.m_height = 0x100;
  storage_config_3.m_to_id = 0;
  storage_config_3.m_width = 0x100;
  storage_config_3.m_levels = getAmountOfLevelsForTexture(0x100,0x100);
  storage_config_4.m_depth = 0xc;
  storage_config_4.m_height = 0xad;
  storage_config_4.m_to_id = 0;
  storage_config_4.m_width = 0xad;
  storage_config_4.m_levels = getAmountOfLevelsForTexture(0xad,0xad);
  std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::push_back
            (this_00,&storage_config_1);
  std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::push_back
            (this_00,&storage_config_2);
  std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::push_back
            (this_00,&storage_config_3);
  std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::push_back
            (this_00,&storage_config_4);
  uVar7 = 0;
  while( true ) {
    uVar8 = (ulong)uVar7;
    pSVar2 = (this->m_storage_configs).
             super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl
             .super__Vector_impl_data._M_start;
    lVar6 = (long)(this->m_storage_configs).
                  super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2;
    if ((ulong)(lVar6 / 0x14) <= uVar8) break;
    pSVar1 = pSVar2 + uVar8;
    (**(code **)(lVar5 + 0x6f8))(1,&pSVar2[uVar8].m_to_id);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glGenTextures() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                    ,0x10b);
    (**(code **)(lVar5 + 0xb8))(0x9009,pSVar2[uVar8].m_to_id);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glBindTexture() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                    ,0x10e);
    (**(code **)(lVar5 + 0x1360))(0x9009,0x2800,0x2601);
    (**(code **)(lVar5 + 0x1360))(0x9009,0x2801,0x2601);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glTexParameteri() call(s) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                    ,0x112);
    if (this->m_storage_type == ST_MUTABLE) {
      (**(code **)(lVar5 + 0x1320))
                (0x9009,0,0x8058,pSVar1->m_width,pSVar1->m_height,pSVar1->m_depth,0,0x1908,0x1401,0)
      ;
      dVar4 = (**(code **)(lVar5 + 0x800))();
      msg = "glTexImage3D() call failed";
      iVar3 = 0x11a;
    }
    else {
      (**(code **)(lVar5 + 0x1398))
                (0x9009,pSVar1->m_levels,0x8058,pSVar1->m_width,pSVar1->m_height,pSVar1->m_depth);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      msg = "glTexStorage3D() call failed";
      iVar3 = 0x123;
    }
    glu::checkError(dVar4,msg,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                    ,iVar3);
    uVar7 = uVar7 + 1;
  }
  (**(code **)(lVar5 + 0x6d0))(1,&this->m_fbo_id,lVar6 % 0x14);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glGenFramebuffers() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                  ,0x129);
  return;
}

Assistant:

void TextureCubeMapArrayGenerateMipMapFilterable::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Make sure the storage config container is empty */
	m_storage_configs.clear();

	/* Update pixel pack/unpack settings */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei() call(s) failed");

	/* Define following texture configurations
	 *
	 *    [width x height x depth]
	 * 1)   64   x   64   x  18;
	 * 2)  117   x  117   x   6;
	 * 3)  256   x  256   x   6;
	 * 4)  173   x  173   x  12;
	 *
	 * We use GL_RGBA8 internal format in all cases.
	 */

	/* Resolution 64 x 64 x 18 */
	StorageConfig storage_config_1;

	storage_config_1.m_width  = 64;
	storage_config_1.m_height = 64;
	storage_config_1.m_depth  = 18;
	storage_config_1.m_to_id  = 0;
	storage_config_1.m_levels = getAmountOfLevelsForTexture(storage_config_1.m_width, storage_config_1.m_height);

	/* Resolution 117 x 117 x 6 */
	StorageConfig storage_config_2;

	storage_config_2.m_width  = 117;
	storage_config_2.m_height = 117;
	storage_config_2.m_depth  = 6;
	storage_config_2.m_to_id  = 0;
	storage_config_2.m_levels = getAmountOfLevelsForTexture(storage_config_2.m_width, storage_config_2.m_height);

	/* Resolution 256 x 256 x 6 */
	StorageConfig storage_config_3;

	storage_config_3.m_width  = 256;
	storage_config_3.m_height = 256;
	storage_config_3.m_depth  = 6;
	storage_config_3.m_to_id  = 0;
	storage_config_3.m_levels = getAmountOfLevelsForTexture(storage_config_3.m_width, storage_config_3.m_height);

	/* Resolution 173 x 173 x 12 */
	StorageConfig storage_config_4;

	storage_config_4.m_width  = 173;
	storage_config_4.m_height = 173;
	storage_config_4.m_depth  = 12;
	storage_config_4.m_to_id  = 0;
	storage_config_4.m_levels = getAmountOfLevelsForTexture(storage_config_4.m_width, storage_config_4.m_height);

	m_storage_configs.push_back(storage_config_1);
	m_storage_configs.push_back(storage_config_2);
	m_storage_configs.push_back(storage_config_3);
	m_storage_configs.push_back(storage_config_4);

	/* Generate and configure a texture object for each storage config. */
	for (unsigned int n_storage_config = 0; n_storage_config < m_storage_configs.size(); n_storage_config++)
	{
		StorageConfig& config = m_storage_configs[n_storage_config];

		gl.genTextures(1, &config.m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed");

		gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, config.m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri() call(s) failed");

		if (m_storage_type == ST_MUTABLE)
		{
			gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0,									/* level */
						  GL_RGBA8, config.m_width, config.m_height, config.m_depth, 0, /* border */
						  GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage3D() call failed");
		}
		else
		{
			DE_ASSERT(m_storage_type == ST_IMMUTABLE);

			gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, config.m_levels, GL_RGBA8, config.m_width, config.m_height,
							config.m_depth);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage3D() call failed");
		}
	} /* for (all storage configs) */

	/* Generate a frame-buffer object */
	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call failed");
}